

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int mbedtls_ecp_export(mbedtls_ecp_keypair *key,mbedtls_ecp_group *grp,mbedtls_mpi *d,
                      mbedtls_ecp_point *Q)

{
  int ret;
  mbedtls_ecp_point *Q_local;
  mbedtls_mpi *d_local;
  mbedtls_ecp_group *grp_local;
  mbedtls_ecp_keypair *key_local;
  
  key_local._4_4_ = mbedtls_ecp_group_copy(grp,&key->grp);
  if (((key_local._4_4_ == 0) &&
      (key_local._4_4_ = mbedtls_mpi_copy(d,&key->d), key_local._4_4_ == 0)) &&
     (key_local._4_4_ = mbedtls_ecp_copy(Q,&key->Q), key_local._4_4_ == 0)) {
    key_local._4_4_ = 0;
  }
  return key_local._4_4_;
}

Assistant:

int mbedtls_ecp_export(const mbedtls_ecp_keypair *key, mbedtls_ecp_group *grp,
                       mbedtls_mpi *d, mbedtls_ecp_point *Q)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    if ((ret = mbedtls_ecp_group_copy(grp, &key->grp)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_mpi_copy(d, &key->d)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_ecp_copy(Q, &key->Q)) != 0) {
        return ret;
    }

    return 0;
}